

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O0

bool __thiscall QDockWidgetPrivate::mousePressEvent(QDockWidgetPrivate *this,QMouseEvent *event)

{
  bool bVar1;
  byte bVar2;
  MouseButton MVar3;
  Int IVar4;
  QDockWidget *pQVar5;
  QDockWidgetGroupWindow *this_00;
  QMainWindow *pQVar6;
  QPoint *in_RSI;
  QDockWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QDockWidgetGroupWindow *floatingTab;
  QDockWidgetLayout *dwLayout;
  QDockWidget *q;
  QRect titleArea;
  DockWidgetFeature in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff74;
  undefined1 in_stack_ffffffffffffff75;
  undefined1 in_stack_ffffffffffffff76;
  undefined1 uVar7;
  QDockWidgetLayout *in_stack_ffffffffffffff80;
  undefined1 nca;
  QDockWidgetPrivate *this_01;
  bool local_51;
  QFlagsStorageHelper<Qt::KeyboardModifier,_4> local_4c;
  QPointF local_48;
  QPoint local_38;
  QPointF local_30;
  QPoint local_20;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  pQVar5 = q_func(in_RDI);
  nca = (undefined1)((ulong)pQVar5 >> 0x38);
  qobject_cast<QDockWidgetLayout*>((QObject *)0x58d78e);
  bVar1 = QDockWidgetLayout::nativeWindowDeco(in_stack_ffffffffffffff80);
  if (bVar1) {
    local_51 = false;
    goto LAB_0058d9cd;
  }
  local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = (undefined1  [16])QDockWidgetLayout::titleArea((QDockWidgetLayout *)in_RDI);
  this_00 = qobject_cast<QDockWidgetGroupWindow*>((QObject *)0x58d7ee);
  MVar3 = QSinglePointEvent::button((QSinglePointEvent *)in_RSI);
  uVar7 = true;
  if (MVar3 == LeftButton) {
    local_30 = QSinglePointEvent::position((QSinglePointEvent *)0x58d818);
    local_20 = QPointF::toPoint((QPointF *)this_00);
    bVar2 = QRect::contains((QPoint *)local_18,SUB81(&local_20,0));
    uVar7 = true;
    if ((bVar2 & 1) != 0) {
      bVar1 = hasFeature((QDockWidgetPrivate *)
                         CONCAT17(1,CONCAT16(in_stack_ffffffffffffff76,
                                             CONCAT15(in_stack_ffffffffffffff75,
                                                      CONCAT14(in_stack_ffffffffffffff74,
                                                               in_stack_ffffffffffffff70)))),
                         in_stack_ffffffffffffff6c);
      if (!bVar1) {
        bVar1 = QDockWidget::isFloating((QDockWidget *)0x58d873);
        uVar7 = true;
        if (!bVar1) goto LAB_0058d8cf;
      }
      pQVar6 = qobject_cast<QMainWindow*>((QObject *)0x58d890);
      if ((pQVar6 != (QMainWindow *)0x0) || (uVar7 = true, this_00 != (QDockWidgetGroupWindow *)0x0)
         ) {
        bVar1 = isAnimating(in_RDI);
        uVar7 = true;
        if (!bVar1) {
          uVar7 = in_RDI->state != (DragState *)0x0;
        }
      }
    }
  }
LAB_0058d8cf:
  if ((bool)uVar7 != false) {
    local_51 = false;
    goto LAB_0058d9cd;
  }
  local_48 = QSinglePointEvent::position((QSinglePointEvent *)0x58d8ed);
  local_38 = QPointF::toPoint((QPointF *)this_00);
  initDrag(this_01,in_RSI,(bool)nca);
  if (in_RDI->state != (DragState *)0x0) {
    bVar1 = hasFeature((QDockWidgetPrivate *)
                       CONCAT17(uVar7,CONCAT16(in_stack_ffffffffffffff76,
                                               CONCAT15(in_stack_ffffffffffffff75,
                                                        CONCAT14(in_stack_ffffffffffffff74,
                                                                 in_stack_ffffffffffffff70)))),
                       in_stack_ffffffffffffff6c);
    if (bVar1) {
      QInputEvent::modifiers
                ((QInputEvent *)
                 CONCAT17(uVar7,CONCAT16(in_stack_ffffffffffffff76,
                                         CONCAT15(in_stack_ffffffffffffff75,
                                                  CONCAT14(in_stack_ffffffffffffff74,
                                                           in_stack_ffffffffffffff70)))));
      local_4c.super_QFlagsStorage<Qt::KeyboardModifier>.i =
           (QFlagsStorage<Qt::KeyboardModifier>)
           QFlags<Qt::KeyboardModifier>::operator&
                     ((QFlags<Qt::KeyboardModifier> *)
                      CONCAT17(uVar7,CONCAT16(in_stack_ffffffffffffff76,
                                              CONCAT15(in_stack_ffffffffffffff75,
                                                       CONCAT14(in_stack_ffffffffffffff74,
                                                                in_stack_ffffffffffffff70)))),
                      in_stack_ffffffffffffff6c);
      IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_4c);
      in_stack_ffffffffffffff76 = true;
      if (IVar4 == 0) goto LAB_0058d979;
    }
    else {
LAB_0058d979:
      bVar1 = hasFeature((QDockWidgetPrivate *)
                         CONCAT17(uVar7,CONCAT16(in_stack_ffffffffffffff76,
                                                 CONCAT15(in_stack_ffffffffffffff75,
                                                          CONCAT14(in_stack_ffffffffffffff74,
                                                                   in_stack_ffffffffffffff70)))),
                         in_stack_ffffffffffffff6c);
      in_stack_ffffffffffffff76 = false;
      if (!bVar1) {
        in_stack_ffffffffffffff76 = QDockWidget::isFloating((QDockWidget *)0x58d99f);
      }
    }
    in_RDI->state->ctrlDrag = (bool)in_stack_ffffffffffffff76;
  }
  local_51 = true;
LAB_0058d9cd:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_51;
}

Assistant:

bool QDockWidgetPrivate::mousePressEvent(QMouseEvent *event)
{
#if QT_CONFIG(mainwindow)
    Q_Q(QDockWidget);

    QDockWidgetLayout *dwLayout
        = qobject_cast<QDockWidgetLayout*>(layout);

    if (!dwLayout->nativeWindowDeco()) {
        QRect titleArea = dwLayout->titleArea();

        QDockWidgetGroupWindow *floatingTab = qobject_cast<QDockWidgetGroupWindow*>(parent);

        if (event->button() != Qt::LeftButton ||
            !titleArea.contains(event->position().toPoint()) ||
            // check if the tool window is movable... do nothing if it
            // is not (but allow moving if the window is floating)
            (!hasFeature(this, QDockWidget::DockWidgetMovable) && !q->isFloating()) ||
            (qobject_cast<QMainWindow*>(parent) == nullptr && !floatingTab) ||
            isAnimating() || state != nullptr) {
            return false;
        }

        initDrag(event->position().toPoint(), false);

        if (state)
            state->ctrlDrag = (hasFeature(this, QDockWidget::DockWidgetFloatable) && event->modifiers() & Qt::ControlModifier) ||
                              (!hasFeature(this, QDockWidget::DockWidgetMovable) && q->isFloating());

        return true;
    }

#endif // QT_CONFIG(mainwindow)
    return false;
}